

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

array<float,_3>
pbrt::SampleSphericalTriangle(array<pbrt::Point3<float>,_3> *v,Point3f *p,Point2f *u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  char *args;
  long in_FS_OFFSET;
  undefined1 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float __x;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [56];
  undefined1 auVar25 [64];
  float fVar27;
  float fVar28;
  undefined1 auVar30 [60];
  undefined1 auVar29 [64];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 uVar43;
  Vector3<float> VVar44;
  array<float,_3> aVar45;
  float va;
  float fStack_b4;
  float local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  int vb;
  float fStack_7c;
  float local_78;
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  if (pdf != (Float *)0x0) {
    *pdf = 0.0;
  }
  fVar36 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  local_a8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar35 = v->values[0].super_Tuple3<pbrt::Point3,_float>.x - fVar36;
  fVar37 = v->values[0].super_Tuple3<pbrt::Point3,_float>.y - local_a8;
  fVar27 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  fVar39 = v->values[0].super_Tuple3<pbrt::Point3,_float>.z - fVar27;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * fVar37)),ZEXT416((uint)fVar35),
                            ZEXT416((uint)fVar35));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
  fVar33 = auVar18._0_4_;
  va = fVar33;
  uVar9 = _vb >> 0x20;
  if (fVar33 <= 0.0) {
    args = "LengthSquared(a)";
    iVar10 = 0x2c;
  }
  else {
    fVar31 = v->values[1].super_Tuple3<pbrt::Point3,_float>.x - fVar36;
    fVar32 = v->values[1].super_Tuple3<pbrt::Point3,_float>.y - local_a8;
    fVar34 = v->values[1].super_Tuple3<pbrt::Point3,_float>.z - fVar27;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * fVar32)),ZEXT416((uint)fVar31),
                              ZEXT416((uint)fVar31));
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
    fVar38 = auVar14._0_4_;
    va = fVar38;
    if (fVar38 <= 0.0) {
      args = "LengthSquared(b)";
      iVar10 = 0x2d;
    }
    else {
      fVar36 = v->values[2].super_Tuple3<pbrt::Point3,_float>.x - fVar36;
      local_a8 = v->values[2].super_Tuple3<pbrt::Point3,_float>.y - local_a8;
      fVar27 = v->values[2].super_Tuple3<pbrt::Point3,_float>.z - fVar27;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_a8 * local_a8)),ZEXT416((uint)fVar36),
                                ZEXT416((uint)fVar36));
      auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      fVar28 = auVar15._0_4_;
      va = fVar28;
      _vb = uVar9 << 0x20;
      if (0.0 < fVar28) {
        local_68._0_4_ = fVar27;
        if (fVar33 < 0.0) {
          fVar27 = sqrtf(fVar33);
          auVar14 = ZEXT416((uint)fVar38);
        }
        else {
          auVar18 = vsqrtss_avx(auVar18,auVar18);
          fVar27 = auVar18._0_4_;
        }
        if (auVar14._0_4_ < 0.0) {
          fVar33 = sqrtf(auVar14._0_4_);
        }
        else {
          auVar18 = vsqrtss_avx(auVar14,auVar14);
          fVar33 = auVar18._0_4_;
        }
        fVar35 = fVar35 / fVar27;
        fVar37 = fVar37 / fVar27;
        fVar39 = fVar39 / fVar27;
        fVar31 = fVar31 / fVar33;
        fVar32 = fVar32 / fVar33;
        fVar34 = fVar34 / fVar33;
        if (fVar28 < 0.0) {
          local_90 = sqrtf(fVar28);
        }
        else {
          auVar18 = vsqrtss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
          local_90 = auVar18._0_4_;
        }
        auVar15 = ZEXT416((uint)fVar31);
        auVar19 = ZEXT416((uint)fVar35);
        auVar13 = ZEXT416((uint)fVar34);
        auVar21 = ZEXT416((uint)fVar37);
        auVar18 = vfmsub213ss_fma(auVar13,auVar21,ZEXT416((uint)(fVar39 * fVar32)));
        auVar20 = ZEXT416((uint)fVar32);
        auVar17 = ZEXT416((uint)fVar39);
        auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar32)),auVar17,auVar20);
        fVar27 = auVar18._0_4_ + auVar14._0_4_;
        auVar18 = vfmsub213ss_fma(auVar15,auVar17,ZEXT416((uint)(fVar35 * fVar34)));
        auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar34)),auVar19,auVar13);
        fVar33 = auVar18._0_4_ + auVar14._0_4_;
        auVar18 = vfmsub213ss_fma(auVar20,auVar19,ZEXT416((uint)(fVar37 * fVar31)));
        auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar37 * fVar31)),auVar21,auVar15);
        fVar38 = auVar18._0_4_ + auVar14._0_4_;
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar27),
                                  ZEXT416((uint)fVar27));
        auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
        fVar28 = 0.0;
        uVar43 = 0;
        __x = auVar18._0_4_;
        bVar7 = NAN(__x);
        bVar8 = __x != 0.0;
        if ((bVar8) || (bVar7)) {
          local_70 = fVar36 / local_90;
          auVar40 = ZEXT416((uint)local_70);
          local_8c = local_a8 / local_90;
          auVar41 = ZEXT416((uint)local_8c);
          local_90 = (float)local_68._0_4_ / local_90;
          auVar42 = ZEXT416((uint)local_90);
          auVar14 = vfmsub213ss_fma(auVar42,auVar20,ZEXT416((uint)(local_8c * fVar34)));
          auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(local_8c * fVar34)),auVar13,auVar41);
          auVar12 = vaddss_avx512f(auVar14,auVar12);
          auVar14 = vfmsub213ss_fma(auVar40,auVar13,ZEXT416((uint)(local_90 * fVar31)));
          auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(local_90 * fVar31)),auVar15,auVar42);
          auVar13 = vaddss_avx512f(auVar14,auVar13);
          auVar14 = vfmsub213ss_fma(auVar41,auVar15,ZEXT416((uint)(local_70 * fVar32)));
          auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(local_70 * fVar32)),auVar20,auVar40);
          auVar14 = vaddss_avx512f(auVar14,auVar15);
          auVar15 = vmulss_avx512f(auVar13,auVar13);
          auVar15 = vfmadd231ss_avx512f(auVar15,auVar12,auVar12);
          vfmadd231ss_avx512f(auVar15,auVar14,auVar14);
          fVar28 = 0.0;
          vucomiss_avx512f(ZEXT816(0) << 0x20);
          if ((bVar8) || (bVar7)) {
            auVar15 = vfmsub213ss_fma(auVar17,auVar41,ZEXT416((uint)(local_90 * fVar37)));
            auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_90 * fVar37)),auVar42,auVar21);
            auVar16 = vaddss_avx512f(auVar15,auVar20);
            auVar15 = vfmsub213ss_fma(auVar19,auVar42,ZEXT416((uint)(fVar39 * local_70)));
            auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar39 * local_70)),auVar40,auVar17);
            auVar17 = vaddss_avx512f(auVar15,auVar20);
            auVar15 = vfmsub213ss_fma(auVar21,auVar40,ZEXT416((uint)(local_8c * fVar35)));
            auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_8c * fVar35)),auVar41,auVar19);
            local_6c = auVar15._0_4_ + auVar20._0_4_;
            auVar15 = vmulss_avx512f(auVar17,auVar17);
            auVar15 = vfmadd231ss_avx512f(auVar15,auVar16,auVar16);
            vfmadd231ss_avx512f(auVar15,ZEXT416((uint)local_6c),ZEXT416((uint)local_6c));
            auVar20 = ZEXT816(0) << 0x20;
            fVar28 = 0.0;
            auVar15 = vucomiss_avx512f(auVar20);
            if ((bVar8) || (bVar7)) {
              uVar11 = __x < 0.0;
              local_38._0_4_ = auVar13._0_4_;
              local_48._0_4_ = auVar14._0_4_;
              local_58._0_4_ = auVar16._0_4_;
              local_84 = auVar17._0_4_;
              local_88 = auVar15._0_4_;
              if ((bool)uVar11) {
                fVar36 = sqrtf(__x);
                auVar20 = ZEXT816(0) << 0x40;
              }
              else {
                auVar18 = vsqrtss_avx(auVar18,auVar18);
                fVar36 = auVar18._0_4_;
              }
              auVar18 = vucomiss_avx512f(auVar20);
              if ((bool)uVar11) {
                fVar28 = sqrtf(auVar18._0_4_);
              }
              else {
                auVar18 = vsqrtss_avx512f(auVar18,auVar18);
                fVar28 = auVar18._0_4_;
              }
              local_68._0_4_ = fVar27 / fVar36;
              local_68._4_12_ = SUB6012((undefined1  [60])0x0,0);
              local_a8 = fVar33 / fVar36;
              fVar38 = fVar38 / fVar36;
              uStack_a4 = 0;
              uStack_a0 = 0;
              uStack_9c = 0;
              if (local_88 < 0.0) {
                fVar36 = sqrtf(local_88);
              }
              else {
                auVar18 = vsqrtss_avx(ZEXT416((uint)local_88),ZEXT416((uint)local_88));
                fVar36 = auVar18._0_4_;
              }
              auVar14._0_4_ = auVar12._0_4_ / fVar28;
              auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
              fVar27 = (float)local_38._0_4_ / fVar28;
              fVar28 = (float)local_48._0_4_ / fVar28;
              local_48._0_4_ = (float)local_58._0_4_ / fVar36;
              local_48._4_12_ = SUB6012((undefined1  [60])0x0,0);
              fVar33 = local_84 / fVar36;
              local_38 = ZEXT416((uint)fVar33);
              fVar36 = local_6c / fVar36;
              local_58 = ZEXT416((uint)fVar36);
              auVar18 = vfnmsub231ss_fma(ZEXT416((uint)(local_a8 * fVar33)),local_68,local_48);
              auVar18 = vfnmadd231ss_fma(auVar18,ZEXT416((uint)fVar38),local_58);
              if (0.0 <= auVar18._0_4_) {
                auVar18 = ZEXT416((uint)(-(float)local_48._0_4_ - local_68._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)((-fVar33 - local_a8) * (-fVar33 - local_a8)
                                                        )),auVar18,auVar18);
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(-fVar36 - fVar38)),
                                          ZEXT416((uint)(-fVar36 - fVar38)));
                if (auVar18._0_4_ < 0.0) {
                  fVar36 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar36 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar36 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar36 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                fVar36 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                fVar36 = fVar36 + fVar36;
              }
              else {
                auVar18 = ZEXT416((uint)(local_68._0_4_ - (float)local_48._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)((local_a8 - fVar33) * (local_a8 - fVar33)))
                                          ,auVar18,auVar18);
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(fVar38 - fVar36)),
                                          ZEXT416((uint)(fVar38 - fVar36)));
                if (auVar18._0_4_ < 0.0) {
                  fVar36 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar36 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar36 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar36 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                auVar22._0_4_ =
                     asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                auVar22._4_60_ = extraout_var;
                auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar22._0_16_,
                                          ZEXT416(0x40490fdb));
                fVar36 = auVar18._0_4_;
              }
              auVar18 = vfnmsub231ss_fma(ZEXT416((uint)(local_a8 * fVar27)),auVar14,local_68);
              auVar18 = vfnmadd231ss_fma(auVar18,ZEXT416((uint)fVar28),ZEXT416((uint)fVar38));
              if (0.0 <= auVar18._0_4_) {
                auVar18 = ZEXT416((uint)(-local_68._0_4_ - auVar14._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)((-local_a8 - fVar27) * (-local_a8 - fVar27)
                                                        )),auVar18,auVar18);
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(-fVar38 - fVar28)),
                                          ZEXT416((uint)(-fVar38 - fVar28)));
                if (auVar18._0_4_ < 0.0) {
                  fVar33 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar33 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar33 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar33 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                fVar33 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                fVar33 = fVar33 + fVar33;
              }
              else {
                auVar18 = ZEXT416((uint)(auVar14._0_4_ - local_68._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)((fVar27 - local_a8) * (fVar27 - local_a8)))
                                          ,auVar18,auVar18);
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(fVar28 - fVar38)),
                                          ZEXT416((uint)(fVar28 - fVar38)));
                if (auVar18._0_4_ < 0.0) {
                  fVar33 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar33 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar33 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar33 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                auVar23._0_4_ =
                     asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                auVar23._4_60_ = extraout_var_00;
                auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar23._0_16_,
                                          ZEXT416(0x40490fdb));
                fVar33 = auVar18._0_4_;
              }
              auVar18 = vfnmsub231ss_fma(ZEXT416((uint)((float)local_38._0_4_ * fVar27)),local_48,
                                         auVar14);
              auVar18 = vfnmadd231ss_fma(auVar18,local_58,ZEXT416((uint)fVar28));
              if (0.0 <= auVar18._0_4_) {
                auVar18 = ZEXT416((uint)(-auVar14._0_4_ - local_48._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)((-fVar27 - (float)local_38._0_4_) *
                                                        (-fVar27 - (float)local_38._0_4_))),auVar18,
                                          auVar18);
                auVar14 = ZEXT416((uint)(-fVar28 - local_58._0_4_));
                auVar18 = vfmadd231ss_fma(auVar18,auVar14,auVar14);
                if (auVar18._0_4_ < 0.0) {
                  fVar27 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar27 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                fVar27 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                fVar27 = fVar27 + fVar27;
              }
              else {
                auVar18 = ZEXT416((uint)(local_48._0_4_ - auVar14._0_4_));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_38._0_4_ - fVar27) *
                                                        ((float)local_38._0_4_ - fVar27))),auVar18,
                                          auVar18);
                auVar14 = ZEXT416((uint)(local_58._0_4_ - fVar28));
                auVar18 = vfmadd231ss_fma(auVar18,auVar14,auVar14);
                if (auVar18._0_4_ < 0.0) {
                  fVar27 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar27 = auVar18._0_4_;
                }
                auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
                uVar43 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0)
                                        ,1);
                bVar7 = (bool)((byte)uVar43 & 1);
                auVar24._0_4_ =
                     asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar18._0_4_));
                auVar24._4_60_ = extraout_var_01;
                auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar24._0_16_,
                                          ZEXT416(0x40490fdb));
                fVar27 = auVar18._0_4_;
              }
              fVar27 = fVar36 + fVar33 + fVar27 + -3.1415927;
              fVar28 = 0.0;
              uVar43 = 0;
              if (0.0 < fVar27) {
                if (pdf != (Float *)0x0) {
                  *pdf = 1.0 / fVar27;
                }
                fVar27 = fVar27 * (u->super_Tuple2<pbrt::Point2,_float>).x;
                fVar33 = cosf(fVar36);
                fVar38 = sinf(fVar36);
                fVar36 = sinf(fVar27);
                fVar28 = cosf(fVar27);
                auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * fVar38)),ZEXT416((uint)fVar36),
                                          ZEXT416((uint)fVar33));
                fVar28 = auVar18._0_4_;
                fVar36 = cosf(fVar27);
                fVar27 = sinf(fVar27);
                auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * fVar27)),ZEXT416((uint)fVar33),
                                          ZEXT416((uint)fVar36));
                fVar36 = auVar14._0_4_ - fVar33;
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * fVar32)),ZEXT416((uint)fVar35),
                                          ZEXT416((uint)fVar31));
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar39),ZEXT416((uint)fVar34));
                auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar38),ZEXT416((uint)fVar28));
                auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * fVar36)),auVar18,auVar14);
                auVar15 = vfmsub213ss_fma(auVar15,ZEXT416((uint)fVar33),auVar18);
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * fVar36)),
                                          ZEXT416((uint)fVar28),auVar18);
                auVar18._0_4_ = auVar15._0_4_ / (fVar38 * auVar18._0_4_);
                auVar18._4_12_ = auVar15._4_12_;
                if (NAN(auVar18._0_4_)) {
                  LogFatal<char_const(&)[17]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                             ,0x55,"Check failed: %s",(char (*) [17])"!IsNaN(cosBetap)");
                }
                auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar18);
                uVar43 = vcmpss_avx512f(auVar18,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar7 = (bool)((byte)uVar43 & 1);
                auVar15._4_12_ = auVar14._4_12_;
                auVar15._0_4_ = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar14._0_4_);
                auVar18 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
                auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
                if (auVar18._0_4_ < 0.0) {
                  fVar36 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar36 = auVar18._0_4_;
                }
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * local_8c)),ZEXT416((uint)local_70)
                                          ,ZEXT416((uint)fVar35));
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_90),ZEXT416((uint)fVar39));
                fVar38 = auVar18._0_4_;
                fVar27 = local_70 - fVar35 * fVar38;
                fVar33 = local_8c - fVar37 * fVar38;
                fVar38 = local_90 - fVar39 * fVar38;
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar27),
                                          ZEXT416((uint)fVar27));
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
                if (auVar18._0_4_ < 0.0) {
                  local_68._0_4_ = fVar38;
                  local_a8 = fVar33;
                  fVar28 = sqrtf(auVar18._0_4_);
                  fVar33 = local_a8;
                  fVar38 = (float)local_68._0_4_;
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar28 = auVar18._0_4_;
                }
                fVar27 = fVar35 * auVar15._0_4_ + fVar36 * (fVar27 / fVar28);
                fVar35 = fVar37 * auVar15._0_4_ + fVar36 * (fVar33 / fVar28);
                fVar36 = fVar39 * auVar15._0_4_ + fVar36 * (fVar38 / fVar28);
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar32)),ZEXT416((uint)fVar27),
                                          ZEXT416((uint)fVar31));
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar36),ZEXT416((uint)fVar34));
                fVar37 = auVar18._0_4_;
                auVar18 = vfnmadd132ss_fma(ZEXT416((uint)(1.0 - fVar37)),
                                           SUB6416(ZEXT464(0x3f800000),0),
                                           ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).y));
                fVar39 = auVar18._0_4_;
                auVar18 = vfnmadd213ss_fma(auVar18,auVar18,SUB6416(ZEXT464(0x3f800000),0));
                auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
                if (auVar18._0_4_ < 0.0) {
                  fVar33 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar33 = auVar18._0_4_;
                }
                fVar27 = fVar27 - fVar31 * fVar37;
                fVar35 = fVar35 - fVar32 * fVar37;
                fVar36 = fVar36 - fVar34 * fVar37;
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),ZEXT416((uint)fVar27),
                                          ZEXT416((uint)fVar27));
                auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
                if (auVar18._0_4_ < 0.0) {
                  fVar37 = sqrtf(auVar18._0_4_);
                }
                else {
                  auVar18 = vsqrtss_avx(auVar18,auVar18);
                  fVar37 = auVar18._0_4_;
                }
                fVar27 = fVar39 * fVar31 + fVar33 * (fVar27 / fVar37);
                fVar35 = fVar39 * fVar32 + fVar33 * (fVar35 / fVar37);
                fVar37 = fVar39 * fVar34 + fVar33 * (fVar36 / fVar37);
                uVar1 = v->values[1].super_Tuple3<pbrt::Point3,_float>.x;
                uVar4 = v->values[1].super_Tuple3<pbrt::Point3,_float>.y;
                auVar20._4_4_ = uVar4;
                auVar20._0_4_ = uVar1;
                auVar20._8_8_ = 0;
                uVar9._0_4_ = v->values[0].super_Tuple3<pbrt::Point3,_float>.x;
                uVar9._4_4_ = v->values[0].super_Tuple3<pbrt::Point3,_float>.y;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = uVar9;
                auVar18 = vsubps_avx(auVar20,auVar13);
                fVar36 = v->values[0].super_Tuple3<pbrt::Point3,_float>.z;
                local_b0 = v->values[1].super_Tuple3<pbrt::Point3,_float>.z - fVar36;
                auVar15 = ZEXT416((uint)local_b0);
                _va = vmovlps_avx(auVar18);
                fVar33 = v->values[2].super_Tuple3<pbrt::Point3,_float>.x - (float)(undefined4)uVar9
                ;
                auVar18 = vmovshdup_avx(auVar13);
                fVar31 = v->values[2].super_Tuple3<pbrt::Point3,_float>.y - auVar18._0_4_;
                fVar36 = v->values[2].super_Tuple3<pbrt::Point3,_float>.z - fVar36;
                auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar36),ZEXT416((uint)fVar35),
                                          ZEXT416((uint)(fVar31 * fVar37)));
                auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar37)),ZEXT416((uint)fVar37),
                                           ZEXT416((uint)fVar31));
                fVar39 = auVar18._0_4_ + auVar14._0_4_;
                auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)fVar37),
                                          ZEXT416((uint)(fVar27 * fVar36)));
                auVar14 = vfnmadd213ss_fma(ZEXT416((uint)fVar36),ZEXT416((uint)fVar27),
                                           ZEXT416((uint)(fVar27 * fVar36)));
                fVar36 = auVar18._0_4_ + auVar14._0_4_;
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fStack_b4)),ZEXT416((uint)fVar39),
                                          ZEXT416((uint)va));
                if (SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                    ::reg == '\0') {
                  local_a8 = local_b0;
                  iVar10 = __cxa_guard_acquire(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                                ::reg);
                  auVar15 = ZEXT416((uint)local_a8);
                  if (iVar10 != 0) {
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                ::reg,SampleSphericalTriangle(pstd::array<pbrt::
                                      Point3<float>,3>const&,pbrt::Point3<float>const&,pbrt::
                                      Point2<float>const&,float*)::$_0::__invoke(pbrt::
                                      StatsAccumulator__,(PixelAccumFunc)0x0);
                    __cxa_guard_release(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                         ::reg);
                    auVar15 = ZEXT416((uint)local_a8);
                  }
                }
                auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)fVar27),
                                          ZEXT416((uint)(fVar35 * fVar33)));
                auVar20 = vfnmadd213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)fVar35),
                                           ZEXT416((uint)(fVar35 * fVar33)));
                fVar33 = auVar14._0_4_ + auVar20._0_4_;
                auVar18 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar33),ZEXT416(auVar18._0_4_));
                *(long *)(in_FS_OFFSET + -0x478) = *(long *)(in_FS_OFFSET + -0x478) + 1;
                local_a8 = auVar18._0_4_;
                if ((local_a8 != 0.0) || (NAN(local_a8))) {
                  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).x;
                  uVar5 = (p->super_Tuple3<pbrt::Point3,_float>).y;
                  auVar21._4_4_ = uVar5;
                  auVar21._0_4_ = uVar2;
                  auVar21._8_8_ = 0;
                  uVar3 = v->values[0].super_Tuple3<pbrt::Point3,_float>.x;
                  uVar6 = v->values[0].super_Tuple3<pbrt::Point3,_float>.y;
                  auVar17._4_4_ = uVar6;
                  auVar17._0_4_ = uVar3;
                  auVar17._8_8_ = 0;
                  auVar18 = vsubps_avx(auVar21,auVar17);
                  fVar31 = (p->super_Tuple3<pbrt::Point3,_float>).z -
                           v->values[0].super_Tuple3<pbrt::Point3,_float>.z;
                  _vb = vmovlps_avx(auVar18);
                  auVar26 = (undefined1  [56])0x0;
                  auVar18 = vfmadd132ss_fma(ZEXT416((uint)fVar39),
                                            ZEXT416((uint)(fVar36 * fStack_7c)),ZEXT416((uint)vb));
                  auVar30 = ZEXT1260(auVar18._4_12_);
                  local_78 = fVar31;
                  VVar44 = Cross<float>((Vector3<float> *)&vb,(Vector3<float> *)&va);
                  auVar29._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar29._4_60_ = auVar30;
                  auVar25._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar25._8_56_ = auVar26;
                  auVar18 = vfmadd132ss_fma(ZEXT416((uint)fVar33),ZEXT416(auVar18._0_4_),
                                            ZEXT416((uint)fVar31));
                  auVar14 = ZEXT416((uint)((1.0 / local_a8) * auVar18._0_4_));
                  auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
                  uVar43 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
                  fVar36 = (float)((uint)!(bool)((byte)uVar43 & 1) * auVar18._0_4_);
                  auVar19._4_12_ = auVar18._4_12_;
                  auVar18 = vmovshdup_avx(auVar25._0_16_);
                  auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar27),auVar25._0_16_,
                                            ZEXT416((uint)(auVar18._0_4_ * fVar35)));
                  auVar18 = vfmadd231ss_fma(auVar18,auVar29._0_16_,ZEXT416((uint)fVar37));
                  auVar14 = ZEXT416((uint)((1.0 / local_a8) * auVar18._0_4_));
                  auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
                  uVar43 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x40,1);
                  fVar27 = (float)((uint)!(bool)((byte)uVar43 & 1) * auVar18._0_4_);
                  bVar7 = 1.0 < fVar36 + fVar27;
                  fVar35 = fVar36 / (fVar36 + fVar27);
                  auVar19._0_4_ = (float)((uint)bVar7 * (int)fVar35 + (uint)!bVar7 * (int)fVar36);
                  fVar28 = (float)((uint)bVar7 * (int)(fVar27 / (fVar27 + fVar35)) +
                                  (uint)!bVar7 * (int)fVar27);
                  auVar18 = vinsertps_avx(ZEXT416((uint)((1.0 - auVar19._0_4_) - fVar28)),auVar19,
                                          0x10);
                  uVar43 = auVar18._0_8_;
                }
                else {
                  *(long *)(in_FS_OFFSET + -0x480) = *(long *)(in_FS_OFFSET + -0x480) + 1;
                  fVar28 = 0.33333334;
                  uVar43 = 0x3eaaaaab3eaaaaab;
                }
              }
            }
          }
        }
        aVar45.values[2] = fVar28;
        aVar45.values[0] = (float)(int)uVar43;
        aVar45.values[1] = (float)(int)((ulong)uVar43 >> 0x20);
        return (array<float,_3>)aVar45.values;
      }
      args = "LengthSquared(c)";
      iVar10 = 0x2e;
    }
  }
  _vb = uVar9 << 0x20;
  LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
             ,iVar10,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [17])args,
             (char (*) [2])0x28e1834,(char (*) [17])args,&va,(char (*) [2])0x28e1834,&vb);
}

Assistant:

pstd::array<Float, 3> SampleSphericalTriangle(const pstd::array<Point3f, 3> &v,
                                              const Point3f &p, const Point2f &u,
                                              Float *pdf) {
    if (pdf != nullptr)
        *pdf = 0;
    // Compute vectors _a_, _b_, and _c_ to spherical triangle vertices
    Vector3f a(v[0] - p), b(v[1] - p), c(v[2] - p);
    CHECK_GT(LengthSquared(a), 0);
    CHECK_GT(LengthSquared(b), 0);
    CHECK_GT(LengthSquared(c), 0);
    a = Normalize(a);
    b = Normalize(b);
    c = Normalize(c);

    // Compute normalized cross products of all direction pairs
    Vector3f n_ab = Cross(a, b), n_bc = Cross(b, c), n_ca = Cross(c, a);
    if (LengthSquared(n_ab) == 0 || LengthSquared(n_bc) == 0 || LengthSquared(n_ca) == 0)
        return {};
    n_ab = Normalize(n_ab);
    n_bc = Normalize(n_bc);
    n_ca = Normalize(n_ca);

    // Compute angles $\alpha$, $\beta$, and $\gamma$ at spherical triangle vertices
    Float alpha = AngleBetween(n_ab, -n_ca);
    Float beta = AngleBetween(n_bc, -n_ab);
    Float gamma = AngleBetween(n_ca, -n_bc);

    // Uniformly sample triangle area $A$ to compute $A'$
    Float A = alpha + beta + gamma - Pi;
    if (A <= 0)
        return {};
    if (pdf != nullptr)
        *pdf = 1 / A;
    Float Ap = u[0] * A;

    // Compute $\sin \beta'$ and $\cos \beta'$ for point along _b_ for sampled area
    Float cosAlpha = std::cos(alpha), sinAlpha = std::sin(alpha);

    Float sinPhi = std::sin(Ap) * cosAlpha - std::cos(Ap) * sinAlpha;
    Float cosPhi = std::cos(Ap) * cosAlpha + std::sin(Ap) * sinAlpha;

    Float uu = cosPhi - cosAlpha;
    Float vv = sinPhi + sinAlpha * Dot(a, b) /* cos c */;
    Float cosBetap = (((vv * cosPhi - uu * sinPhi) * cosAlpha - vv) /
                      ((vv * sinPhi + uu * cosPhi) * sinAlpha));
    // Happens if the triangle basically covers the entire hemisphere.
    // We currently depend on calling code to detect this case, which
    // is sort of ugly/unfortunate.
    CHECK(!IsNaN(cosBetap));
    cosBetap = Clamp(cosBetap, -1, 1);
    Float sinBetap = SafeSqrt(1 - cosBetap * cosBetap);

    // Compute $c'$ along the arc between $b'$ and $a$
    Vector3f cp = cosBetap * a + sinBetap * Normalize(GramSchmidt(c, a));

    // Compute sampled spherical triangle direction and return barycentrics
    Float cosTheta = 1 - u[1] * (1 - Dot(cp, b));
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f w = cosTheta * b + sinTheta * Normalize(GramSchmidt(cp, b));
    // Find barycentric coordinates for sampled direction _w_
    Vector3f e1(v[1] - v[0]), e2(v[2] - v[0]);
    Vector3f s1 = Cross(w, e2);
    Float divisor = Dot(s1, e1);
    CHECK_RARE(1e-6, divisor == 0);
    if (divisor == 0) {
        // This happens with triangles that cover (nearly) the whole
        // hemisphere.
        return {1.f / 3.f, 1.f / 3.f, 1.f / 3.f};
    }
    Float invDivisor = 1 / divisor;
    Vector3f s(p - v[0]);
    Float b1 = Dot(s, s1) * invDivisor;
    Vector3f s2 = Cross(s, e1);
    Float b2 = Dot(w, s2) * invDivisor;

    // Return clamped barycentrics for sampled direction
    b1 = Clamp(b1, 0, 1);
    b2 = Clamp(b2, 0, 1);
    if (b1 + b2 > 1) {
        b1 /= b1 + b2;
        b2 /= b1 + b2;
    }
    return {Float(1 - b1 - b2), Float(b1), Float(b2)};
}